

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

bool __thiscall
flatbuffers::Parser::ParseFlexBuffer
          (Parser *this,char *source,char *source_filename,Builder *builder)

{
  int iVar1;
  byte bVar2;
  undefined1 local_2c [2];
  undefined1 local_2a [2];
  
  iVar1 = this->parse_depth_counter_;
  StartParseFile((Parser *)local_2c,(char *)this,source);
  local_2c[1] = true;
  if (local_2c[0] == false) {
    ParseFlexBufferValue((Parser *)local_2a,(Builder *)this);
    local_2a[1] = true;
    bVar2 = local_2a[0] ^ 1;
    CheckedError::~CheckedError((CheckedError *)local_2a);
  }
  else {
    bVar2 = 0;
  }
  CheckedError::~CheckedError((CheckedError *)local_2c);
  if (bVar2 != 0) {
    flexbuffers::Builder::Finish(builder);
  }
  if (iVar1 == this->parse_depth_counter_) {
    return (bool)bVar2;
  }
  __assert_fail("initial_depth == parse_depth_counter_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                ,0xd83,
                "bool flatbuffers::Parser::ParseFlexBuffer(const char *, const char *, flexbuffers::Builder *)"
               );
}

Assistant:

bool Parser::ParseFlexBuffer(const char *source, const char *source_filename,
                             flexbuffers::Builder *builder) {
  const auto initial_depth = parse_depth_counter_;
  (void)initial_depth;
  auto ok = !StartParseFile(source, source_filename).Check() &&
            !ParseFlexBufferValue(builder).Check();
  if (ok) builder->Finish();
  FLATBUFFERS_ASSERT(initial_depth == parse_depth_counter_);
  return ok;
}